

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::compress_internal(crn_comp *this)

{
  undefined8 *puVar1;
  uint *p;
  void *pvVar2;
  uchar *puVar3;
  undefined8 uVar4;
  crn_progress_callback_func p_Var5;
  bool bVar6;
  crn_bool cVar7;
  vector<unsigned_short> *pAlpha_endpoint_remap;
  ulong uVar8;
  vector<unsigned_short> *pColor_endpoint_remap;
  vector<unsigned_short> *pColor_selector_remap;
  vector<unsigned_short> *pAlpha_selector_remap;
  long lVar9;
  symbol_codec *pCodec;
  long lVar10;
  int iVar11;
  static_huffman_data_model *this_00;
  uint *puVar12;
  long lVar13;
  symbol_codec local_c8;
  
  bVar6 = alias_images(this);
  if ((bVar6) && (bVar6 = quantize_images(this), bVar6)) {
    p = (this->m_reference_hist).m_hist.m_p;
    if (p != (uint *)0x0) {
      crnlib_free(p);
      (this->m_reference_hist).m_hist.m_p = (uint *)0x0;
      (this->m_reference_hist).m_hist.m_size = 0;
      (this->m_reference_hist).m_hist.m_capacity = 0;
    }
    this_00 = (static_huffman_data_model *)&this->field_0x1ee0;
    lVar9 = 0;
    do {
      pvVar2 = *(void **)((long)&this->m_endpoint_remaping[0].m_p + lVar9);
      if (pvVar2 != (void *)0x0) {
        crnlib_free(pvVar2);
        *(undefined8 *)((long)&this->m_endpoint_remaping[0].m_p + lVar9) = 0;
        *(undefined8 *)((long)&this->m_endpoint_remaping[0].m_size + lVar9) = 0;
      }
      pvVar2 = *(void **)((long)&this->m_endpoint_index_hist[0].m_hist.m_p + lVar9);
      if (pvVar2 != (void *)0x0) {
        crnlib_free(pvVar2);
        *(undefined8 *)((long)&this->m_endpoint_index_hist[0].m_hist.m_p + lVar9) = 0;
        *(undefined8 *)((long)&this->m_endpoint_index_hist[0].m_hist.m_size + lVar9) = 0;
      }
      static_huffman_data_model::clear(this_00);
      pvVar2 = *(void **)((long)&this->m_selector_remaping[0].m_p + lVar9);
      if (pvVar2 != (void *)0x0) {
        crnlib_free(pvVar2);
        *(undefined8 *)((long)&this->m_selector_remaping[0].m_p + lVar9) = 0;
        *(undefined8 *)((long)&this->m_selector_remaping[0].m_size + lVar9) = 0;
      }
      pvVar2 = *(void **)((long)&this->m_selector_index_hist[0].m_hist.m_p + lVar9);
      if (pvVar2 != (void *)0x0) {
        puVar1 = (undefined8 *)((long)&this->m_selector_index_hist[0].m_hist.m_p + lVar9);
        crnlib_free(pvVar2);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      static_huffman_data_model::clear((static_huffman_data_model *)&this_00[3].m_codes);
      lVar9 = lVar9 + 0x10;
      this_00 = this_00 + 1;
    } while (lVar9 == 0x10);
    if (this->m_has_comp[0] != false) {
      optimize_color(this);
    }
    if (this->m_has_comp[1] == true) {
      optimize_alpha(this);
    }
    iVar11 = 0;
    do {
      if ((this->m_levels).m_size != 0) {
        pCodec = &local_c8;
        if (iVar11 == 0) {
          pCodec = (symbol_codec *)0x0;
        }
        uVar8 = 0;
        puVar12 = &this->m_packed_blocks[0].m_size;
        do {
          symbol_codec::symbol_codec(&local_c8);
          symbol_codec::start_encoding(&local_c8,0x200000);
          bVar6 = this->m_has_comp[0] != false;
          pColor_endpoint_remap = (vector<unsigned_short> *)0x0;
          if (bVar6) {
            pColor_endpoint_remap = this->m_endpoint_remaping;
          }
          pColor_selector_remap = (vector<unsigned_short> *)0x0;
          if (bVar6) {
            pColor_selector_remap = this->m_selector_remaping;
          }
          bVar6 = this->m_has_comp[1] != false;
          pAlpha_endpoint_remap = (vector<unsigned_short> *)0x0;
          if (bVar6) {
            pAlpha_endpoint_remap = this->m_endpoint_remaping + 1;
          }
          pAlpha_selector_remap = (vector<unsigned_short> *)0x0;
          if (bVar6) {
            pAlpha_selector_remap = this->m_selector_remaping + 1;
          }
          pack_blocks(this,(uint)uVar8,iVar11 == 0 && (uint)uVar8 == 0,pCodec,pColor_endpoint_remap,
                      pColor_selector_remap,pAlpha_endpoint_remap,pAlpha_selector_remap);
          symbol_codec::stop_encoding(&local_c8,false);
          if (iVar11 != 0) {
            puVar3 = ((vector<unsigned_char> *)(puVar12 + -2))->m_p;
            ((vector<unsigned_char> *)(puVar12 + -2))->m_p = local_c8.m_output_buf.m_p;
            uVar4 = *(undefined8 *)puVar12;
            *(undefined8 *)puVar12 = local_c8.m_output_buf._8_8_;
            local_c8.m_output_buf.m_p = puVar3;
            local_c8.m_output_buf._8_8_ = uVar4;
          }
          if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
            crnlib_free(local_c8.m_output_syms.m_p);
          }
          if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
            crnlib_free(local_c8.m_arith_output_buf.m_p);
          }
          if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
            crnlib_free(local_c8.m_output_buf.m_p);
          }
          uVar8 = uVar8 + 1;
          puVar12 = puVar12 + 4;
        } while (uVar8 < (this->m_levels).m_size);
      }
      if (iVar11 == 0) {
        static_huffman_data_model::init(&this->m_reference_dm,(EVP_PKEY_CTX *)0x1);
        lVar13 = 0x1ee0;
        lVar10 = 0x1f90;
        lVar9 = 0;
        do {
          if (*(int *)((long)&this->m_endpoint_index_hist[0].m_hist.m_size + lVar9) != 0) {
            static_huffman_data_model::init
                      ((static_huffman_data_model *)
                       ((long)(this->m_task_pool).m_task_stack.m_stack + lVar13 + -0x10),
                       (EVP_PKEY_CTX *)0x1);
          }
          if (*(int *)((long)&this->m_selector_index_hist[0].m_hist.m_size + lVar9) != 0) {
            static_huffman_data_model::init
                      ((static_huffman_data_model *)
                       ((long)(this->m_task_pool).m_task_stack.m_stack + lVar10 + -0x10),
                       (EVP_PKEY_CTX *)0x1);
          }
          lVar13 = lVar13 + 0x38;
          lVar9 = lVar9 + 0x10;
          lVar10 = lVar10 + 0x38;
        } while (lVar13 == 0x1f18);
      }
      bVar6 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar6);
    bVar6 = pack_data_models(this);
    if (bVar6) {
      create_comp_data(this);
      p_Var5 = this->m_pParams->m_pProgress_func;
      if ((p_Var5 == (crn_progress_callback_func)0x0) ||
         (cVar7 = (*p_Var5)(0x18,0x19,1,1,this->m_pParams->m_pProgress_func_data), cVar7 != 0)) {
        if (-1 < (int)this->m_pParams->m_flags) {
          return true;
        }
        crnlib_print_mem_stats();
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool crn_comp::compress_internal() {
  if (!alias_images())
    return false;
  if (!quantize_images())
    return false;

  m_reference_hist.clear();
  for (uint i = 0; i < 2; i++) {
    m_endpoint_remaping[i].clear();
    m_endpoint_index_hist[i].clear();
    m_endpoint_index_dm[i].clear();
    m_selector_remaping[i].clear();
    m_selector_index_hist[i].clear();
    m_selector_index_dm[i].clear();
  }

  if (m_has_comp[cColor])
    optimize_color();

  if (m_has_comp[cAlpha0])
    optimize_alpha();

  for (uint pass = 0; pass < 2; pass++) {
    for (uint level = 0; level < m_levels.size(); level++) {
      symbol_codec codec;
      codec.start_encoding(2 * 1024 * 1024);

      if (!pack_blocks(
          level,
          !pass && !level, pass ? &codec : NULL,
          m_has_comp[cColor] ? &m_endpoint_remaping[cColor] : NULL, m_has_comp[cColor] ? &m_selector_remaping[cColor] : NULL,
          m_has_comp[cAlpha0] ? &m_endpoint_remaping[cAlpha0] : NULL, m_has_comp[cAlpha0] ? &m_selector_remaping[cAlpha0] : NULL)) {
        return false;
      }

      codec.stop_encoding(false);

      if (pass)
        m_packed_blocks[level].swap(codec.get_encoding_buf());
    }

    if (!pass) {
      m_reference_dm.init(true, m_reference_hist, 16);

      for (uint i = 0; i < 2; i++) {
        if (m_endpoint_index_hist[i].size())
          m_endpoint_index_dm[i].init(true, m_endpoint_index_hist[i], 16);

        if (m_selector_index_hist[i].size())
          m_selector_index_dm[i].init(true, m_selector_index_hist[i], 16);
      }
    }
  }

  if (!pack_data_models())
    return false;

  if (!create_comp_data())
    return false;

  if (!update_progress(24, 1, 1))
    return false;

  if (m_pParams->m_flags & cCRNCompFlagDebugging) {
    crnlib_print_mem_stats();
  }

  return true;
}